

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::DetectionOutput::forward
          (DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *this_00;
  vector<float,std::allocator<float>> *this_01;
  size_t __size;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  pointer pMVar4;
  void *pvVar5;
  void *pvVar6;
  iterator __position;
  iterator __position_00;
  Mat *this_02;
  size_t sVar7;
  bool bVar8;
  pointer pvVar9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar10;
  int iVar11;
  int iVar12;
  int *piVar13;
  undefined4 extraout_var;
  float *pfVar14;
  pointer pfVar15;
  float *pfVar16;
  uint uVar17;
  BBoxRect *__args;
  size_type sVar18;
  uint uVar19;
  void *pvVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  size_type __new_size;
  float fVar26;
  float fVar27;
  undefined4 extraout_XMM0_Db;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> bbox_rects;
  vector<float,_std::allocator<float>_> bbox_scores;
  vector<int,_std::allocator<int>_> picked;
  Mat bboxes;
  vector<float,_std::allocator<float>_> class_bbox_scores;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  all_class_bbox_scores;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  all_class_bbox_rects;
  int local_1bc;
  vector<float,_std::allocator<float>_> local_1b8;
  vector<float,_std::allocator<float>_> local_198;
  DetectionOutput *local_180;
  void *local_178;
  iterator iStack_170;
  int *local_168;
  ulong local_160;
  int local_154;
  ulong local_150;
  float *local_148;
  undefined8 uStack_140;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  Allocator *local_128;
  undefined8 uStack_120;
  int local_118;
  int iStack_114;
  long lStack_110;
  vector<float,_std::allocator<float>_> local_108;
  undefined8 local_e8;
  size_type local_d0;
  ulong local_c8;
  pointer local_c0;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  Option *local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_80;
  long local_78;
  float *local_70;
  vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_154 = this->num_class;
  if (local_154 == -0xe9) {
    local_160 = (ulong)(uint)pMVar4[2].h;
    local_150 = local_160;
  }
  else {
    iVar11 = pMVar4[2].w;
    iVar12 = iVar11 + 3;
    if (-1 < iVar11) {
      iVar12 = iVar11;
    }
    local_160 = (ulong)(uint)(iVar12 >> 2);
    local_150 = 1;
  }
  piVar13 = &this->num_class;
  if (local_154 == -0xe9) {
    piVar13 = &pMVar4[1].h;
  }
  local_d0 = (size_type)*piVar13;
  local_128 = opt->workspace_allocator;
  local_148 = (float *)0x0;
  uStack_140._0_4_ = 0;
  uStack_140._4_4_ = 0;
  uStack_140 = (float *)0x0;
  uStack_138 = 4;
  uStack_134 = 0;
  uStack_130 = 1;
  uStack_120 = 0x400000002;
  local_118 = (int)local_160;
  iStack_114 = 1;
  lVar23 = (long)(local_118 * 4);
  local_180 = this;
  lStack_110 = lVar23;
  if (local_118 != 0) {
    __size = lVar23 * 4 + 4;
    if (local_128 == (Allocator *)0x0) {
      local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (float *)0x0;
      iVar11 = posix_memalign((void **)&local_1b8,0x10,__size);
      local_148 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
      if (iVar11 != 0) {
        local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (float *)0x0;
        local_148 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
    }
    else {
      iVar11 = (*local_128->_vptr_Allocator[2])(local_128,__size);
      local_148 = (float *)CONCAT44(extraout_var,iVar11);
    }
    uStack_140 = local_148 + lVar23;
    local_148[lVar23] = 1.4013e-45;
  }
  iVar11 = -100;
  if ((local_148 != (float *)0x0) && (iStack_114 * lStack_110 != 0)) {
    pvVar5 = pMVar4[2].data;
    if (local_154 == -0xe9) {
      pvVar20 = (void *)0x0;
    }
    else {
      pvVar20 = (void *)((long)pMVar4[2].w * pMVar4[2].elemsize + (long)pvVar5);
    }
    local_c8 = local_160 & 0xffffffff;
    local_c0 = pMVar4;
    local_88 = opt;
    local_80 = top_blobs;
    if (0 < (int)local_160) {
      pvVar6 = pMVar4->data;
      local_70 = local_180->variances;
      local_78 = (long)uStack_120._4_4_ * CONCAT44(uStack_134,uStack_138);
      lVar22 = local_c8 << 4;
      lVar23 = 0;
      pfVar16 = local_148;
      do {
        pfVar14 = (float *)((long)pvVar20 + lVar23);
        if (pvVar20 == (void *)0x0) {
          pfVar14 = local_70;
        }
        uVar3 = *(undefined8 *)((long)pvVar6 + lVar23);
        local_98 = CONCAT44((float)((ulong)uVar3 >> 0x20) *
                            (float)((ulong)*(undefined8 *)pfVar14 >> 0x20),
                            (float)uVar3 * (float)*(undefined8 *)pfVar14);
        uStack_90 = 0;
        uVar3 = *(undefined8 *)((long)pvVar6 + lVar23 + 8);
        fVar27 = (float)((ulong)uVar3 >> 0x20) *
                 (float)((ulong)*(undefined8 *)(pfVar14 + 2) >> 0x20);
        local_48 = CONCAT44(fVar27,(float)uVar3 * (float)*(undefined8 *)(pfVar14 + 2));
        uStack_40 = 0;
        fVar27 = expf(fVar27);
        local_e8 = CONCAT44(extraout_XMM0_Db,fVar27);
        fVar27 = expf((float)local_48);
        pfVar14 = (float *)((long)pvVar5 + lVar23);
        fVar29 = pfVar14[2] - *pfVar14;
        fVar30 = pfVar14[3] - pfVar14[1];
        fVar26 = (*pfVar14 + pfVar14[2]) * 0.5 + fVar29 * (float)local_98;
        fVar28 = (pfVar14[1] + pfVar14[3]) * 0.5 + fVar30 * local_98._4_4_;
        fVar27 = fVar27 * fVar29 * 0.5;
        fVar29 = (float)local_e8 * fVar30 * 0.5;
        *pfVar16 = fVar26 - fVar27;
        pfVar16[1] = fVar28 - fVar29;
        pfVar16[2] = fVar26 + fVar27;
        pfVar16[3] = fVar28 + fVar29;
        pfVar16 = (float *)((long)pfVar16 + local_78);
        lVar23 = lVar23 + 0x10;
      } while (lVar22 != lVar23);
    }
    __new_size = local_d0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::resize(&local_68,local_d0);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::resize(&local_b8,__new_size);
    if (1 < (int)__new_size) {
      uVar24 = 1;
      if (local_154 != -0xe9) {
        uVar24 = __new_size & 0xffffffff;
      }
      local_150 = local_150 << 2;
      sVar18 = 1;
      local_e8 = local_150;
      do {
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (float *)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = (float *)0x0;
        if (0 < (int)local_160) {
          uVar25 = 0;
          uVar21 = local_e8;
          do {
            fVar27 = *(float *)((long)local_c0[1].data + uVar21);
            local_178 = (void *)CONCAT44(local_178._4_4_,fVar27);
            if (local_180->confidence_threshold <= fVar27 &&
                fVar27 != local_180->confidence_threshold) {
              lVar23 = (long)(int)uVar25 * (long)uStack_120._4_4_ * CONCAT44(uStack_134,uStack_138);
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148 + lVar23 + 4),
                                     *(float *)((long)local_148 + lVar23));
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)CONCAT44(*(undefined4 *)((long)local_148 + lVar23 + 0xc),
                                     *(undefined4 *)((long)local_148 + lVar23 + 8));
              local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(local_1b8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     (int)sVar18);
              if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
                _M_realloc_insert<ncnn::BBoxRect_const&>
                          ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_198,
                           (iterator)
                           local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(BBoxRect *)&local_1b8);
              }
              else {
                *(int *)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_finish + 0x10) = (int)sVar18;
                *(pointer *)
                 local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish =
                     local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
                *(pointer *)
                 ((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_finish + 8) =
                     local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     (pointer)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish + 0x14);
              }
              if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)&local_108,
                           (iterator)
                           local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(float *)&local_178);
              }
              else {
                *local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_178._0_4_;
                local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar25 = uVar25 + 1;
            uVar21 = uVar21 + uVar24 * 4;
          } while (local_c8 != uVar25);
        }
        qsort_descent_inplace<ncnn::BBoxRect>
                  ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,&local_108)
        ;
        iVar11 = local_180->nms_top_k;
        iVar12 = (int)((ulong)((long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_198.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2);
        if (SBORROW4(iVar11,iVar12 * -0x33333333) != iVar11 + iVar12 * 0x33333333 < 0) {
          std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                    ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_198,
                     (long)iVar11);
          std::vector<float,_std::allocator<float>_>::resize(&local_108,(long)local_180->nms_top_k);
        }
        local_178 = (void *)0x0;
        local_168 = (int *)0x0;
        iStack_170._M_current = (int *)0x0;
        local_98 = CONCAT44(local_98._4_4_,local_180->nms_threshold);
        uVar19 = (int)((long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) * -0x33333333;
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1b8,(long)(int)uVar19,(allocator_type *)&local_1bc);
        if ((int)uVar19 < 1) {
          local_1bc = 0;
        }
        else {
          pfVar15 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start + 2;
          uVar21 = 0;
          do {
            local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar21] =
                 ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) -
                 (float)((ulong)*(undefined8 *)(pfVar15 + -2) >> 0x20)) *
                 ((float)*(undefined8 *)pfVar15 - (float)*(undefined8 *)(pfVar15 + -2));
            uVar21 = uVar21 + 1;
            pfVar15 = pfVar15 + 5;
          } while ((uVar19 & 0x7fffffff) != uVar21);
          local_1bc = 0;
          if (0 < (int)uVar19) {
            do {
              uVar17 = (uint)((ulong)((long)iStack_170._M_current - (long)local_178) >> 2);
              if ((int)uVar17 < 1) {
LAB_001565d2:
                if (iStack_170._M_current == local_168) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_178,iStack_170,&local_1bc);
                }
                else {
                  *iStack_170._M_current = local_1bc;
                  iStack_170._M_current = iStack_170._M_current + 1;
                }
              }
              else {
                pfVar16 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start + (long)local_1bc * 5;
                fVar27 = *pfVar16;
                bVar8 = true;
                uVar21 = 0;
                do {
                  lVar23 = (long)*(int *)((long)local_178 + uVar21 * 4);
                  fVar26 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar23 * 5 + 2];
                  fVar28 = 0.0;
                  if (fVar27 <= fVar26) {
                    pfVar14 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar23 * 5;
                    fVar29 = pfVar16[2];
                    fVar30 = *pfVar14;
                    if (fVar30 <= fVar29) {
                      fVar1 = pfVar16[1];
                      fVar31 = pfVar14[3];
                      if (fVar1 <= fVar31) {
                        fVar2 = pfVar16[3];
                        fVar32 = pfVar14[1];
                        if (fVar32 <= fVar2) {
                          if (fVar29 <= fVar26) {
                            fVar26 = fVar29;
                          }
                          if (fVar30 <= fVar27) {
                            fVar30 = fVar27;
                          }
                          if (fVar2 <= fVar31) {
                            fVar31 = fVar2;
                          }
                          if (fVar32 <= fVar1) {
                            fVar32 = fVar1;
                          }
                          fVar28 = (fVar31 - fVar32) * (fVar26 - fVar30);
                        }
                      }
                    }
                  }
                  if ((float)local_98 <
                      fVar28 / ((local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start[local_1bc] - fVar28) +
                               local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar23])) {
                    bVar8 = false;
                  }
                  uVar21 = uVar21 + 1;
                } while ((uVar17 & 0x7fffffff) != uVar21);
                if (bVar8) goto LAB_001565d2;
              }
              local_1bc = local_1bc + 1;
            } while (local_1bc < (int)uVar19);
          }
        }
        if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (float *)0x0) {
          operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (0 < (int)((ulong)((long)iStack_170._M_current - (long)local_178) >> 2)) {
          lVar23 = 0;
          do {
            lVar22 = (long)*(int *)((long)local_178 + lVar23 * 4);
            __args = (BBoxRect *)
                     (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar22 * 5);
            this_00 = (vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)
                      (local_68.
                       super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar18);
            __position._M_current = *(BBoxRect **)(this_00 + 8);
            if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
              std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
              _M_realloc_insert<ncnn::BBoxRect_const&>(this_00,__position,__args);
            }
            else {
              (__position._M_current)->label = __args->label;
              fVar27 = __args->ymin;
              fVar26 = __args->xmax;
              fVar28 = __args->ymax;
              (__position._M_current)->xmin = __args->xmin;
              (__position._M_current)->ymin = fVar27;
              (__position._M_current)->xmax = fVar26;
              (__position._M_current)->ymax = fVar28;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x14;
            }
            this_01 = (vector<float,std::allocator<float>> *)
                      (local_b8.
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + sVar18);
            __position_00._M_current = *(float **)(this_01 + 8);
            if (__position_00._M_current == *(float **)(this_01 + 0x10)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        (this_01,__position_00,
                         local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar22);
            }
            else {
              *__position_00._M_current =
                   local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar22];
              *(float **)(this_01 + 8) = __position_00._M_current + 1;
            }
            lVar23 = lVar23 + 1;
          } while (lVar23 < (int)((ulong)((long)iStack_170._M_current - (long)local_178) >> 2));
        }
        if (local_178 != (void *)0x0) {
          operator_delete(local_178,(long)local_168 - (long)local_178);
        }
        __new_size = local_d0;
        if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        sVar18 = sVar18 + 1;
        local_e8 = local_e8 + local_150;
      } while (sVar18 != __new_size);
    }
    pvVar10 = local_80;
    local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (float *)0x0;
    local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    if (1 < (int)__new_size) {
      lVar23 = 0;
      do {
        pvVar9 = local_b8.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::BBoxRect_const*,std::vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>>>>
                  ((vector<ncnn::BBoxRect,std::allocator<ncnn::BBoxRect>> *)&local_1b8,
                   local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar23),
                   *(undefined8 *)
                    ((long)&local_68.
                            super__Vector_base<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super__Vector_base<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>.
                            _M_impl.super__Vector_impl_data._M_finish + lVar23));
        std::vector<float,std::allocator<float>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<float_const*,std::vector<float,std::allocator<float>>>>
                  ((vector<float,std::allocator<float>> *)&local_198,
                   local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)&pvVar9[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start + lVar23),
                   *(undefined8 *)
                    ((long)&pvVar9[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_finish + lVar23));
        lVar23 = lVar23 + 0x18;
      } while (__new_size * 0x18 + -0x18 != lVar23);
    }
    qsort_descent_inplace<ncnn::BBoxRect>
              ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1b8,&local_198);
    iVar11 = local_180->keep_top_k;
    iVar12 = (int)((ulong)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start) >> 2);
    if (SBORROW4(iVar11,iVar12 * -0x33333333) != iVar11 + iVar12 * 0x33333333 < 0) {
      std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>::resize
                ((vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_> *)&local_1b8,(long)iVar11)
      ;
      std::vector<float,_std::allocator<float>_>::resize(&local_198,(long)local_180->keep_top_k);
    }
    uVar19 = (int)((long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) * -0x33333333;
    iVar11 = 0;
    if (uVar19 != 0) {
      this_02 = (pvVar10->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      Mat::create(this_02,6,uVar19,4,local_88->blob_allocator);
      iVar11 = -100;
      if (((this_02->data != (void *)0x0) && ((long)this_02->c * this_02->cstep != 0)) &&
         (iVar11 = 0, 0 < (int)uVar19)) {
        iVar12 = this_02->w;
        sVar7 = this_02->elemsize;
        pfVar16 = (float *)((long)this_02->data + 0x14);
        pfVar14 = local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start + 4;
        iVar11 = 0;
        uVar24 = 0;
        do {
          fVar27 = local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar24];
          pfVar16[-5] = (float)(int)*pfVar14;
          pfVar16[-4] = fVar27;
          pfVar16[-3] = pfVar14[-4];
          pfVar16[-2] = pfVar14[-3];
          pfVar16[-1] = pfVar14[-2];
          *pfVar16 = pfVar14[-1];
          uVar24 = uVar24 + 1;
          pfVar16 = (float *)((long)pfVar16 + (long)iVar12 * sVar7);
          pfVar14 = pfVar14 + 5;
        } while ((uVar19 & 0x7fffffff) != uVar24);
      }
    }
    if (local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (float *)0x0) {
      operator_delete(local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector(&local_b8);
    std::
    vector<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>,_std::allocator<std::vector<ncnn::BBoxRect,_std::allocator<ncnn::BBoxRect>_>_>_>
    ::~vector(&local_68);
  }
  if (uStack_140 != (float *)0x0) {
    LOCK();
    *uStack_140 = (float)((int)*uStack_140 + -1);
    UNLOCK();
    if (*uStack_140 == 0.0) {
      if (local_128 == (Allocator *)0x0) {
        if (local_148 != (float *)0x0) {
          free(local_148);
        }
      }
      else {
        (*local_128->_vptr_Allocator[3])();
      }
    }
  }
  return iVar11;
}

Assistant:

int DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& location = bottom_blobs[0];
    const Mat& confidence = bottom_blobs[1];
    const Mat& priorbox = bottom_blobs[2];

    bool mxnet_ssd_style = num_class == -233;

    // mxnet-ssd _contrib_MultiBoxDetection
    const int num_prior = mxnet_ssd_style ? priorbox.h : priorbox.w / 4;

    int num_class_copy = mxnet_ssd_style ? confidence.h : num_class;

    // apply location with priorbox
    Mat bboxes;
    bboxes.create(4, num_prior, 4u, opt.workspace_allocator);
    if (bboxes.empty())
        return -100;

    const float* location_ptr = location;
    const float* priorbox_ptr = priorbox.row(0);
    const float* variance_ptr = mxnet_ssd_style ? 0 : priorbox.row(1);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_prior; i++)
    {
        const float* loc = location_ptr + i * 4;
        const float* pb = priorbox_ptr + i * 4;
        const float* var = variance_ptr ? variance_ptr + i * 4 : variances;

        float* bbox = bboxes.row(i);

        // CENTER_SIZE
        float pb_w = pb[2] - pb[0];
        float pb_h = pb[3] - pb[1];
        float pb_cx = (pb[0] + pb[2]) * 0.5f;
        float pb_cy = (pb[1] + pb[3]) * 0.5f;

        float bbox_cx = var[0] * loc[0] * pb_w + pb_cx;
        float bbox_cy = var[1] * loc[1] * pb_h + pb_cy;
        float bbox_w = exp(var[2] * loc[2]) * pb_w;
        float bbox_h = exp(var[3] * loc[3]) * pb_h;

        bbox[0] = bbox_cx - bbox_w * 0.5f;
        bbox[1] = bbox_cy - bbox_h * 0.5f;
        bbox[2] = bbox_cx + bbox_w * 0.5f;
        bbox[3] = bbox_cy + bbox_h * 0.5f;
    }

    // sort and nms for each class
    std::vector< std::vector<BBoxRect> > all_class_bbox_rects;
    std::vector< std::vector<float> > all_class_bbox_scores;
    all_class_bbox_rects.resize(num_class_copy);
    all_class_bbox_scores.resize(num_class_copy);

    // start from 1 to ignore background class
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 1; i < num_class_copy; i++)
    {
        // filter by confidence_threshold
        std::vector<BBoxRect> class_bbox_rects;
        std::vector<float> class_bbox_scores;

        for (int j = 0; j < num_prior; j++)
        {
            // prob data layout
            // caffe-ssd = num_class x num_prior
            // mxnet-ssd = num_prior x num_class
            float score = mxnet_ssd_style ? confidence[i * num_prior + j] : confidence[j * num_class_copy + i];

            if (score > confidence_threshold)
            {
                const float* bbox = bboxes.row(j);
                BBoxRect c = { bbox[0], bbox[1], bbox[2], bbox[3], i };
                class_bbox_rects.push_back(c);
                class_bbox_scores.push_back(score);
            }
        }

        // sort inplace
        qsort_descent_inplace(class_bbox_rects, class_bbox_scores);

        // keep nms_top_k
        if (nms_top_k < (int)class_bbox_rects.size())
        {
            class_bbox_rects.resize(nms_top_k);
            class_bbox_scores.resize(nms_top_k);
        }

        // apply nms
        std::vector<int> picked;
        nms_sorted_bboxes(class_bbox_rects, picked, nms_threshold);

        // select
        for (int j = 0; j < (int)picked.size(); j++)
        {
            int z = picked[j];
            all_class_bbox_rects[i].push_back(class_bbox_rects[z]);
            all_class_bbox_scores[i].push_back(class_bbox_scores[z]);
        }
    }

    // gather all class
    std::vector<BBoxRect> bbox_rects;
    std::vector<float> bbox_scores;

    for (int i = 1; i < num_class_copy; i++)
    {
        const std::vector<BBoxRect>& class_bbox_rects = all_class_bbox_rects[i];
        const std::vector<float>& class_bbox_scores = all_class_bbox_scores[i];

        bbox_rects.insert(bbox_rects.end(), class_bbox_rects.begin(), class_bbox_rects.end());
        bbox_scores.insert(bbox_scores.end(), class_bbox_scores.begin(), class_bbox_scores.end());
    }

    // global sort inplace
    qsort_descent_inplace(bbox_rects, bbox_scores);

    // keep_top_k
    if (keep_top_k < (int)bbox_rects.size())
    {
        bbox_rects.resize(keep_top_k);
        bbox_scores.resize(keep_top_k);
    }

    // fill result
    int num_detected = bbox_rects.size();
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = bbox_scores[i];
        float* outptr = top_blob.row(i);

        outptr[0] = r.label;
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}